

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simulator.cpp
# Opt level: O0

bool __thiscall
lsim::Simulator::component_has_function
          (Simulator *this,ComponentType comp_type,SimFuncType func_type)

{
  bool bVar1;
  reference this_00;
  reference __f;
  SimFuncType func_type_local;
  ComponentType comp_type_local;
  Simulator *this_local;
  
  if (0x401 < comp_type) {
    __assert_fail("comp_type <= COMPONENT_MAX_TYPE_ID",
                  "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                  ,0x111,"bool lsim::Simulator::component_has_function(ComponentType, SimFuncType)")
    ;
  }
  if (func_type < 4) {
    this_00 = std::
              vector<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>,_std::allocator<std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>_>_>
              ::operator[](&this->m_sim_functions,(ulong)comp_type);
    __f = std::array<std::function<void_(lsim::Simulator_*,_lsim::SimComponent_*)>,_3UL>::operator[]
                    (this_00,(ulong)func_type);
    bVar1 = std::operator!=(__f,(nullptr_t)0x0);
    return bVar1;
  }
  __assert_fail("func_type <= 3",
                "/workspace/llm4binary/github/license_c_cmakelists/JohanSmet[P]lsim/src/simulator.cpp"
                ,0x112,"bool lsim::Simulator::component_has_function(ComponentType, SimFuncType)");
}

Assistant:

bool Simulator::component_has_function(ComponentType comp_type, SimFuncType func_type) {
    assert(comp_type <= COMPONENT_MAX_TYPE_ID);
    assert(func_type <= 3);
    return m_sim_functions[comp_type][func_type] != nullptr;
}